

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  iterator iVar1;
  TestError *pTVar2;
  long lVar3;
  allocator<char> local_389;
  allocator<char> local_388;
  allocator<char> local_387;
  allocator<char> local_386;
  allocator<char> local_385;
  allocator<char> local_384;
  allocator<char> local_383;
  allocator<char> local_382;
  allocator<char> local_381;
  string *local_380;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string array_initializers [4];
  string invalid_size_declarations [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_size_declarations,"[2][2][2][]",(allocator<char> *)array_initializers
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 1),"[2][2][][2]",
             (allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 2),"[2][][2][2]",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 3),"[][2][2][2]",(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 4),"[2][2][][]",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 5),"[2][][2][]",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 6),"[][2][2][]",&local_381);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 7),"[2][][][2]",&local_382);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 8),"[][2][][2]",&local_383);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 9),"[][][2][2]",&local_384);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 10),"[2][][][]",&local_385);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xb),"[][2][][]",&local_386);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xc),"[][][2][]",&local_387);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xd),"[][][][2]",&local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xe),"[][][][]",&local_389);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)array_initializers,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 1),
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 2),
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,(allocator<char> *)&local_338);
  lVar3 = 0;
  while (lVar3 != 3) {
    iVar1 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,test_shader_compilation::var_types_set_es + lVar3
                  );
    local_380 = (string *)lVar3;
    if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c52);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    for (lVar3 = 0; lVar3 != 0x1e0; lVar3 = lVar3 + 0x20) {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&shader_source);
      std::operator+(&local_338,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &iVar1._M_node[1]._M_parent);
      std::operator+(&local_318,&local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&invalid_size_declarations[0]._M_dataplus._M_p + lVar3));
      std::operator+(&local_2f8,&local_318," my_variable;\n");
      std::__cxx11::string::append((string *)&shader_source);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::append((string *)&shader_source);
      switch((ulong)tested_shader_type) {
      case 0:
      case 2:
      case 5:
        break;
      case 1:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case 4:
      case 3:
        std::__cxx11::string::append((string *)&shader_source);
        break;
      default:
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::append((string *)&shader_source);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
      std::__cxx11::string::~string((string *)&shader_source);
    }
    lVar3 = (long)local_380 + 1;
  }
  iVar1 = std::
          _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
          ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                  *)supported_variable_types_map,test_shader_compilation::var_types_set_es);
  if (iVar1._M_node != (_Base_ptr)(supported_variable_types_map + 8)) {
    local_380 = array_initializers;
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    shader_source._M_string_length = 0;
    shader_source.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&shader_source);
    std::operator+(&local_2d8,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[1]._M_parent);
    std::operator+(&local_338,&local_2d8,invalid_size_declarations);
    std::operator+(&local_318,&local_338," my_variable = ");
    std::operator+(&local_2f8,&local_318,local_380);
    std::__cxx11::string::append((string *)&shader_source);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::operator+(&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &iVar1._M_node[1]._M_parent,invalid_size_declarations);
    std::operator+(&local_2f8,&local_318," my_variable = ");
    std::operator+(&local_50,&local_2f8,local_380);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::append((string *)&shader_source);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c72);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(code *)(&DAT_01722508 + *(int *)(&DAT_01722508 + (ulong)tested_shader_type * 4)))();
    return;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1c7a);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}